

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-expression.c
# Opt level: O3

_Bool expression_test_copy(expression_t *a,expression_t *b)

{
  size_t sVar1;
  expression_operation_t *peVar2;
  expression_operation_t *peVar3;
  bool bVar4;
  size_t sVar5;
  
  if ((b != (expression_t *)0x0 && a != (expression_t *)0x0) &&
     (sVar1 = a->operation_count, sVar1 == b->operation_count)) {
    peVar2 = a->operations;
    peVar3 = b->operations;
    bVar4 = (peVar2 != peVar3 && a != b) &&
            (a->operations_size == b->operations_size && a->base_value == b->base_value);
    if (sVar1 != 0) {
      sVar5 = 0;
      do {
        bVar4 = (bool)(bVar4 & (peVar2[sVar5].operator == peVar3[sVar5].operator &&
                               peVar2[sVar5].operand == peVar3[sVar5].operand));
        sVar5 = sVar5 + 1;
      } while (sVar1 != sVar5);
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool expression_test_copy(const expression_t *a, const expression_t *b)
{
	size_t i;
	bool success = true;

	if (a == NULL || b == NULL)
		return false;

	success &= (a != b);
	success &= (a->base_value == b->base_value);
	success &= (a->operation_count == b->operation_count);
	success &= (a->operations_size == b->operations_size);
	success &= (a->operations != b->operations);

	if (a->operation_count != b->operation_count)
		return false;

	for (i = 0; i < a->operation_count; i++) {
		success &= (a->operations[i].operand == b->operations[i].operand);
		success &= (a->operations[i].operator == b->operations[i].operator);
	}

	return success;
}